

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O0

LoopLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::mutable_loop(NeuralNetworkLayer *this)

{
  bool bVar1;
  LoopLayerParams *this_00;
  NeuralNetworkLayer *this_local;
  
  bVar1 = has_loop(this);
  if (!bVar1) {
    clear_layer(this);
    set_has_loop(this);
    this_00 = (LoopLayerParams *)operator_new(0x38);
    LoopLayerParams::LoopLayerParams(this_00);
    (this->layer_).loop_ = this_00;
  }
  return (LoopLayerParams *)(this->layer_).convolution_;
}

Assistant:

inline ::CoreML::Specification::LoopLayerParams* NeuralNetworkLayer::mutable_loop() {
  if (!has_loop()) {
    clear_layer();
    set_has_loop();
    layer_.loop_ = new ::CoreML::Specification::LoopLayerParams;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.NeuralNetworkLayer.loop)
  return layer_.loop_;
}